

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_expect_array_max_or_nil(mpack_reader_t *reader,uint32_t max_count,uint32_t *count)

{
  _Bool has_array;
  uint32_t *count_local;
  uint32_t max_count_local;
  mpack_reader_t *reader_local;
  
  reader_local._7_1_ = mpack_expect_array_or_nil(reader,count);
  if ((reader_local._7_1_) && (max_count < *count)) {
    *count = 0;
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local._7_1_ = false;
  }
  return reader_local._7_1_;
}

Assistant:

bool mpack_expect_array_max_or_nil(mpack_reader_t* reader, uint32_t max_count, uint32_t* count) {
    mpack_assert(count != NULL, "count cannot be NULL");

    bool has_array = mpack_expect_array_or_nil(reader, count);
    if (has_array && *count > max_count) {
        *count = 0;
        mpack_reader_flag_error(reader, mpack_error_type);
        return false;
    }
    return has_array;
}